

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_handle_input(amqp_connection_state_t state,amqp_bytes_t received_data,
                     amqp_frame_t *decoded_frame)

{
  undefined4 *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  size_t sVar7;
  void *pvVar8;
  amqp_pool_t *paVar9;
  uint64_t uVar10;
  byte *in_RCX;
  amqp_pool_t *in_RDX;
  void **in_RSI;
  amqp_connection_state_t in_RDI;
  amqp_bytes_t in_stack_00000000;
  amqp_pool_t *channel_pool_1;
  int res;
  amqp_bytes_t encoded;
  uint32_t frame_size;
  amqp_pool_t *channel_pool;
  amqp_channel_t channel;
  void *raw_frame;
  size_t bytes_consumed;
  void **in_stack_000002b8;
  amqp_pool_t *in_stack_000002c0;
  amqp_method_number_t in_stack_000002cc;
  amqp_bytes_t in_stack_000002d0;
  amqp_bytes_t *in_stack_ffffffffffffff78;
  amqp_connection_state_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  amqp_connection_state_enum aVar11;
  int *local_38;
  int local_30;
  undefined4 in_stack_fffffffffffffffc;
  uint16_t class_id;
  
  class_id = (uint16_t)((uint)in_stack_fffffffffffffffc >> 0x10);
  *in_RCX = 0;
  if (in_RSI == (void **)0x0) {
    return 0;
  }
  if (in_RDI->state == CONNECTION_STATE_IDLE) {
    in_RDI->state = CONNECTION_STATE_HEADER;
  }
  sVar7 = consume_data(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_30 = (int)sVar7;
  if (in_RDI->inbound_offset < in_RDI->target_size) {
    return local_30;
  }
  local_38 = (int *)(in_RDI->inbound_buffer).bytes;
  aVar11 = in_RDI->state;
  if (aVar11 == CONNECTION_STATE_INITIAL) {
    if (*local_38 == 0x50514d41) {
      *in_RCX = 0x41;
      in_RCX[2] = 0;
      in_RCX[3] = 0;
      pvVar8 = amqp_offset(local_38,4);
      bVar3 = amqp_d8(pvVar8);
      in_RCX[8] = bVar3;
      pvVar8 = amqp_offset(local_38,5);
      bVar3 = amqp_d8(pvVar8);
      in_RCX[9] = bVar3;
      pvVar8 = amqp_offset(local_38,6);
      bVar3 = amqp_d8(pvVar8);
      in_RCX[10] = bVar3;
      pvVar8 = amqp_offset(local_38,7);
      bVar3 = amqp_d8(pvVar8);
      in_RCX[0xb] = bVar3;
      return_to_idle(in_RDI);
      return local_30;
    }
LAB_001042be:
    amqp_offset(local_38,1);
    amqp_d16(in_stack_ffffffffffffff80);
    amqp_offset(local_38,3);
    uVar5 = amqp_d32(in_stack_ffffffffffffff80);
    if (0x7ffffffe < uVar5) {
      return -2;
    }
    if ((ulong)(long)in_RDI->frame_max < (ulong)(uVar5 + 8)) {
      return -2;
    }
    paVar9 = amqp_get_or_create_channel_pool
                       ((amqp_connection_state_t)CONCAT44(aVar11,in_stack_ffffffffffffff88),
                        (amqp_channel_t)((ulong)in_stack_ffffffffffffff80 >> 0x30));
    if (paVar9 == (amqp_pool_t *)0x0) {
      return -1;
    }
    amqp_pool_alloc_bytes
              ((amqp_pool_t *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
               (amqp_bytes_t *)0x10438b);
    if ((in_RDI->inbound_buffer).bytes == (void *)0x0) {
      return -1;
    }
    puVar1 = (undefined4 *)(in_RDI->inbound_buffer).bytes;
    *puVar1 = *(undefined4 *)in_RDI->header_buffer;
    *(undefined2 *)(puVar1 + 1) = *(undefined2 *)(in_RDI->header_buffer + 4);
    *(char *)((long)puVar1 + 6) = in_RDI->header_buffer[6];
    local_38 = (int *)(in_RDI->inbound_buffer).bytes;
    in_RDI->state = CONNECTION_STATE_BODY;
    in_RDI->target_size = (ulong)(uVar5 + 8);
    sVar7 = consume_data(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_30 = (int)sVar7 + local_30;
    if (in_RDI->inbound_offset < in_RDI->target_size) {
      return local_30;
    }
  }
  else {
    if (aVar11 == CONNECTION_STATE_HEADER) goto LAB_001042be;
    if (aVar11 != CONNECTION_STATE_BODY) {
      amqp_abort("Internal error: invalid amqp_connection_state_t->state %d",(ulong)in_RDI->state);
    }
  }
  pvVar8 = amqp_offset(local_38,in_RDI->target_size - 1);
  uVar2 = amqp_d8(pvVar8);
  if (uVar2 != 0xce) {
    return -2;
  }
  pvVar8 = amqp_offset(local_38,0);
  bVar3 = amqp_d8(pvVar8);
  *in_RCX = bVar3;
  amqp_offset(local_38,1);
  uVar4 = amqp_d16(in_stack_ffffffffffffff80);
  *(uint16_t *)(in_RCX + 2) = uVar4;
  paVar9 = amqp_get_or_create_channel_pool
                     ((amqp_connection_state_t)CONCAT44(aVar11,in_stack_ffffffffffffff88),
                      (amqp_channel_t)((ulong)in_stack_ffffffffffffff80 >> 0x30));
  if (paVar9 == (amqp_pool_t *)0x0) {
    return -1;
  }
  pvVar8 = (void *)(ulong)(*in_RCX - 1);
  switch(pvVar8) {
  case (void *)0x0:
    amqp_offset(local_38,7);
    uVar5 = amqp_d32(pvVar8);
    *(uint32_t *)(in_RCX + 8) = uVar5;
    amqp_offset(local_38,0xb);
    iVar6 = amqp_decode_method(in_stack_000002cc,in_stack_000002c0,in_stack_000002d0,
                               in_stack_000002b8);
    goto joined_r0x0010468d;
  case (void *)0x1:
    amqp_offset(local_38,7);
    uVar4 = amqp_d16(pvVar8);
    *(uint16_t *)(in_RCX + 8) = uVar4;
    amqp_offset(local_38,0xb);
    uVar10 = amqp_d64(pvVar8);
    *(uint64_t *)(in_RCX + 0x10) = uVar10;
    pvVar8 = amqp_offset(local_38,0x13);
    *(size_t *)(in_RCX + 0x20) = in_RDI->target_size - 0x14;
    *(void **)(in_RCX + 0x28) = pvVar8;
    iVar6 = amqp_decode_properties(class_id,in_RDX,in_stack_00000000,in_RSI);
joined_r0x0010468d:
    if (iVar6 < 0) {
      return iVar6;
    }
    break;
  case (void *)0x2:
    *(size_t *)(in_RCX + 8) = in_RDI->target_size - 8;
    pvVar8 = amqp_offset(local_38,7);
    *(void **)(in_RCX + 0x10) = pvVar8;
    break;
  default:
    *in_RCX = 0;
    break;
  case (void *)0x7:
  }
  return_to_idle(in_RDI);
  return local_30;
}

Assistant:

int amqp_handle_input(amqp_connection_state_t state, amqp_bytes_t received_data,
                      amqp_frame_t *decoded_frame) {
  size_t bytes_consumed;
  void *raw_frame;

  /* Returning frame_type of zero indicates either insufficient input,
     or a complete, ignored frame was read. */
  decoded_frame->frame_type = 0;

  if (received_data.len == 0) {
    return AMQP_STATUS_OK;
  }

  if (state->state == CONNECTION_STATE_IDLE) {
    state->state = CONNECTION_STATE_HEADER;
  }

  bytes_consumed = consume_data(state, &received_data);

  /* do we have target_size data yet? if not, return with the
     expectation that more will arrive */
  if (state->inbound_offset < state->target_size) {
    return (int)bytes_consumed;
  }

  raw_frame = state->inbound_buffer.bytes;

  switch (state->state) {
    case CONNECTION_STATE_INITIAL:
      /* check for a protocol header from the server */
      if (memcmp(raw_frame, "AMQP", 4) == 0) {
        decoded_frame->frame_type = AMQP_PSEUDOFRAME_PROTOCOL_HEADER;
        decoded_frame->channel = 0;

        decoded_frame->payload.protocol_header.transport_high =
            amqp_d8(amqp_offset(raw_frame, 4));
        decoded_frame->payload.protocol_header.transport_low =
            amqp_d8(amqp_offset(raw_frame, 5));
        decoded_frame->payload.protocol_header.protocol_version_major =
            amqp_d8(amqp_offset(raw_frame, 6));
        decoded_frame->payload.protocol_header.protocol_version_minor =
            amqp_d8(amqp_offset(raw_frame, 7));

        return_to_idle(state);
        return (int)bytes_consumed;
      }

      /* it's not a protocol header; fall through to process it as a
         regular frame header */

    case CONNECTION_STATE_HEADER: {
      amqp_channel_t channel;
      amqp_pool_t *channel_pool;
      uint32_t frame_size;

      channel = amqp_d16(amqp_offset(raw_frame, 1));

      /* frame length is 3 bytes in */
      frame_size = amqp_d32(amqp_offset(raw_frame, 3));
      /* To prevent the target_size calculation below from overflowing, check
       * that the stated frame_size is smaller than a signed 32-bit. Given
       * the library only allows configuring frame_max as an int32_t, and
       * frame_size is uint32_t, the math below is safe from overflow. */
      if (frame_size >= INT32_MAX) {
        return AMQP_STATUS_BAD_AMQP_DATA;
      }

      frame_size = frame_size + HEADER_SIZE + FOOTER_SIZE;
      if ((size_t)state->frame_max < frame_size) {
        return AMQP_STATUS_BAD_AMQP_DATA;
      }

      channel_pool = amqp_get_or_create_channel_pool(state, channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      amqp_pool_alloc_bytes(channel_pool, frame_size, &state->inbound_buffer);
      if (NULL == state->inbound_buffer.bytes) {
        return AMQP_STATUS_NO_MEMORY;
      }
      memcpy(state->inbound_buffer.bytes, state->header_buffer, HEADER_SIZE);
      raw_frame = state->inbound_buffer.bytes;

      state->state = CONNECTION_STATE_BODY;
      state->target_size = frame_size;
      bytes_consumed += consume_data(state, &received_data);

      /* do we have target_size data yet? if not, return with the
         expectation that more will arrive */
      if (state->inbound_offset < state->target_size) {
        return (int)bytes_consumed;
      }
    }
      /* fall through to process body */

    case CONNECTION_STATE_BODY: {
      amqp_bytes_t encoded;
      int res;
      amqp_pool_t *channel_pool;

      /* Check frame end marker (footer) */
      if (amqp_d8(amqp_offset(raw_frame, state->target_size - 1)) !=
          AMQP_FRAME_END) {
        return AMQP_STATUS_BAD_AMQP_DATA;
      }

      decoded_frame->frame_type = amqp_d8(amqp_offset(raw_frame, 0));
      decoded_frame->channel = amqp_d16(amqp_offset(raw_frame, 1));

      channel_pool =
          amqp_get_or_create_channel_pool(state, decoded_frame->channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      switch (decoded_frame->frame_type) {
        case AMQP_FRAME_METHOD:
          decoded_frame->payload.method.id =
              amqp_d32(amqp_offset(raw_frame, HEADER_SIZE));
          encoded.bytes = amqp_offset(raw_frame, HEADER_SIZE + 4);
          encoded.len = state->target_size - HEADER_SIZE - 4 - FOOTER_SIZE;

          res = amqp_decode_method(decoded_frame->payload.method.id,
                                   channel_pool, encoded,
                                   &decoded_frame->payload.method.decoded);
          if (res < 0) {
            return res;
          }

          break;

        case AMQP_FRAME_HEADER:
          decoded_frame->payload.properties.class_id =
              amqp_d16(amqp_offset(raw_frame, HEADER_SIZE));
          /* unused 2-byte weight field goes here */
          decoded_frame->payload.properties.body_size =
              amqp_d64(amqp_offset(raw_frame, HEADER_SIZE + 4));
          encoded.bytes = amqp_offset(raw_frame, HEADER_SIZE + 12);
          encoded.len = state->target_size - HEADER_SIZE - 12 - FOOTER_SIZE;
          decoded_frame->payload.properties.raw = encoded;

          res = amqp_decode_properties(
              decoded_frame->payload.properties.class_id, channel_pool, encoded,
              &decoded_frame->payload.properties.decoded);
          if (res < 0) {
            return res;
          }

          break;

        case AMQP_FRAME_BODY:
          decoded_frame->payload.body_fragment.len =
              state->target_size - HEADER_SIZE - FOOTER_SIZE;
          decoded_frame->payload.body_fragment.bytes =
              amqp_offset(raw_frame, HEADER_SIZE);
          break;

        case AMQP_FRAME_HEARTBEAT:
          break;

        default:
          /* Ignore the frame */
          decoded_frame->frame_type = 0;
          break;
      }

      return_to_idle(state);
      return (int)bytes_consumed;
    }

    default:
      amqp_abort("Internal error: invalid amqp_connection_state_t->state %d",
                 state->state);
  }
}